

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_writer.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::ImportWriter::PrintRuntimeImports
          (ImportWriter *this,Printer *p,bool default_cpp_symbol)

{
  long *plVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Printer *pPVar3;
  long *plVar4;
  objectivec *this_00;
  undefined8 extraout_RAX;
  char *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  pointer value_00;
  long lVar5;
  void *unaff_R14;
  string_view framework_name;
  undefined1 local_4fa;
  anon_class_1_0_00000001 local_4f9;
  Printer *local_4f8;
  undefined1 *local_4f0;
  undefined8 local_4e8;
  undefined1 local_4e0;
  undefined7 uStack_4df;
  undefined8 uStack_4d8;
  char *local_4d0;
  size_type local_4c8;
  char local_4c0;
  undefined7 uStack_4bf;
  undefined8 uStack_4b8;
  undefined1 *local_4b0;
  undefined8 local_4a8;
  undefined1 local_4a0;
  undefined7 uStack_49f;
  undefined8 uStack_498;
  string local_490;
  undefined1 local_470 [32];
  string local_450;
  string local_430;
  pointer local_410;
  string local_408;
  string local_3e8;
  Sub local_3c8;
  undefined1 local_310 [56];
  code *local_2d8;
  __index_type local_2d0;
  _Alloc_hider local_2c8;
  size_type local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  bool local_2a8;
  bool local_260;
  Sub local_258;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  undefined8 *local_180;
  undefined8 local_178;
  code *local_170;
  code *local_168;
  undefined1 local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 local_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  local_4fa = default_cpp_symbol;
  local_4f8 = p;
  if ((this->runtime_import_prefix_)._M_string_length == 0) {
    if (this->for_bundled_proto_ == true) {
      if (default_cpp_symbol) {
        PrintRuntimeImports();
        lVar5 = 0x2e0;
        do {
          io::Printer::Sub::~Sub((Sub *)((long)&local_3c8.key_._M_dataplus._M_p + lVar5));
          lVar5 = lVar5 + -0xb8;
        } while (lVar5 != -0xb8);
        if (local_4b0 != (undefined1 *)unaff_R14) {
          operator_delete(local_4b0,CONCAT71(uStack_49f,local_4a0) + 1);
        }
        if (local_4f0 != &local_4e0) {
          operator_delete(local_4f0,CONCAT71(uStack_4df,local_4e0) + 1);
        }
        if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
          operator_delete((void *)local_470._0_8_,local_470._16_8_ + 1);
        }
        if (local_4d0 != &local_4c0) {
          operator_delete(local_4d0,CONCAT71(uStack_4bf,local_4c0) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(extraout_RAX);
      }
      value = (this->protobuf_imports_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (this->protobuf_imports_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (value != pbVar2) {
        do {
          pPVar3 = local_4f8;
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"header","");
          io::Printer::Sub::Sub<std::__cxx11::string_const&>(&local_3c8,&local_3e8,value);
          google::protobuf::io::Printer::Emit
                    (pPVar3,&local_3c8,1,0x32,
                     "\n                #import \"$header$\"\n              ");
          if (local_3c8.annotation_.
              super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
              _M_payload.
              super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
              .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>.
              _M_engaged == true) {
            std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                      ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                       &local_3c8.annotation_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8.value_.consume_after._M_dataplus._M_p !=
              &local_3c8.value_.consume_after.field_2) {
            operator_delete(local_3c8.value_.consume_after._M_dataplus._M_p,
                            local_3c8.value_.consume_after.field_2._M_allocated_capacity + 1);
          }
          (*std::__detail::__variant::
            __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
            ::_S_vtable._M_arr
            [local_3c8.value_.value.
             super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
             .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
             super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
             super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
             super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
             super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
             ._M_index]._M_data)((anon_class_1_0_00000001 *)&local_408,&local_3c8.value_.value);
          local_3c8.value_.value.
          super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
          .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          _M_index = 0xff;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8.key_._M_dataplus._M_p != &local_3c8.key_.field_2) {
            operator_delete(local_3c8.key_._M_dataplus._M_p,
                            local_3c8.key_.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
          }
          value = value + 1;
        } while (value != pbVar2);
      }
    }
    else {
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"cpp_symbol","");
      this_00 = (objectivec *)strlen("Protobuf");
      framework_name._M_str = in_RCX;
      framework_name._M_len = (size_t)"Protobuf";
      ProtobufFrameworkImportSymbol_abi_cxx11_(&local_408,this_00,framework_name);
      io::Printer::Sub::Sub<std::__cxx11::string>(&local_3c8,&local_450,&local_408);
      local_4d0 = &local_4c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4d0,"maybe_default_cpp_symbol","");
      local_310._0_8_ = local_310 + 0x10;
      if (local_4d0 == &local_4c0) {
        local_310._24_8_ = uStack_4b8;
      }
      else {
        local_310._0_8_ = local_4d0;
      }
      local_310._8_8_ = local_4c8;
      local_4c8 = 0;
      local_4c0 = '\0';
      local_4d0 = &local_4c0;
      local_310._32_8_ = operator_new(0x18);
      *(undefined1 **)local_310._32_8_ = &local_4fa;
      *(Printer ***)(local_310._32_8_ + 8) = &local_4f8;
      *(undefined1 *)(local_310._32_8_ + 0x10) = 0;
      local_2d8 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_310._40_8_ = 0;
      local_310._48_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_2d0 = '\x01';
      local_2c8._M_p = (pointer)&local_2b8;
      local_2c0 = 0;
      local_2b8._M_local_buf[0] = '\0';
      local_2a8 = false;
      std::__cxx11::string::_M_replace((ulong)&local_2c8,0,(char *)0x0,0x361ff2);
      local_260 = false;
      local_470._0_8_ = local_470 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"framework_name","");
      io::Printer::Sub::Sub<char_const*const&>
                (&local_258,(string *)local_470,&ProtobufLibraryFrameworkName);
      local_4f0 = &local_4e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"framework_imports","");
      local_1a0 = local_190;
      if (local_4f0 == &local_4e0) {
        uStack_188 = uStack_4d8;
      }
      else {
        local_1a0 = local_4f0;
      }
      local_198 = local_4e8;
      local_4e8 = 0;
      local_4e0 = 0;
      local_4f0 = &local_4e0;
      local_180 = (undefined8 *)operator_new(0x18);
      *local_180 = this;
      local_180[1] = &local_4f8;
      *(undefined1 *)(local_180 + 2) = 0;
      local_168 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_178 = 0;
      local_170 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_160 = 1;
      local_158 = local_148;
      local_150 = 0;
      local_148[0] = 0;
      local_138 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x361ff2);
      local_f0 = 0;
      local_4b0 = &local_4a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"raw_imports","");
      local_e8 = local_d8;
      if (local_4b0 == &local_4a0) {
        uStack_d0 = uStack_498;
      }
      else {
        local_e8 = local_4b0;
      }
      local_e0 = local_4a8;
      local_4a8 = 0;
      local_4a0 = 0;
      local_4b0 = &local_4a0;
      local_c8 = (undefined8 *)operator_new(0x18);
      *local_c8 = this;
      local_c8[1] = &local_4f8;
      *(undefined1 *)(local_c8 + 2) = 0;
      local_b0 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
      local_c0 = 0;
      local_b8 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_manager;
      local_a8 = 1;
      local_a0 = local_90;
      local_98 = 0;
      local_90[0] = 0;
      local_80 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x361ff2);
      local_38 = 0;
      google::protobuf::io::Printer::Emit
                (p,&local_3c8,5,0x95,
                 "\n        $maybe_default_cpp_symbol$\n\n        #if $cpp_symbol$\n         $framework_imports$\n        #else\n         $raw_imports$\n        #endif\n      "
                );
      lVar5 = 0x398;
      do {
        if (local_3e8.field_2._M_local_buf[lVar5 + 8] == '\x01') {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     ((long)&local_410 + lVar5));
        }
        plVar4 = (long *)((long)&local_430._M_string_length + lVar5);
        plVar1 = *(long **)((long)&local_450.field_2 + lVar5 + 8);
        if (plVar4 != plVar1) {
          operator_delete(plVar1,*plVar4 + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[(byte)local_450.field_2._M_local_buf[lVar5]]._M_data)
                  (&local_4f9,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)(local_470 + lVar5 + 0x10));
        local_450.field_2._M_local_buf[lVar5] = -1;
        if ((long *)(local_470 + lVar5) != *(long **)(local_470 + lVar5 + -0x10)) {
          operator_delete(*(long **)(local_470 + lVar5 + -0x10),*(long *)(local_470 + lVar5) + 1);
        }
        lVar5 = lVar5 + -0xb8;
      } while (lVar5 != 0);
      if (local_4b0 != &local_4a0) {
        operator_delete(local_4b0,CONCAT71(uStack_49f,local_4a0) + 1);
      }
      if (local_4f0 != &local_4e0) {
        operator_delete(local_4f0,CONCAT71(uStack_4df,local_4e0) + 1);
      }
      if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
        operator_delete((void *)local_470._0_8_,local_470._16_8_ + 1);
      }
      if (local_4d0 != &local_4c0) {
        operator_delete(local_4d0,CONCAT71(uStack_4bf,local_4c0) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    value_00 = (this->protobuf_imports_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_410 = (this->protobuf_imports_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (value_00 != local_410) {
      do {
        pPVar3 = local_4f8;
        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"import_prefix","");
        io::Printer::Sub::Sub<std::__cxx11::string_const&>
                  (&local_3c8,&local_490,&this->runtime_import_prefix_);
        local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"header","");
        io::Printer::Sub::Sub<std::__cxx11::string_const&>((Sub *)local_310,&local_430,value_00);
        google::protobuf::io::Printer::Emit
                  (pPVar3,&local_3c8,2,0x42,
                   "\n                #import \"$import_prefix$/$header$\"\n              ");
        lVar5 = 0x170;
        do {
          if (local_3e8.field_2._M_local_buf[lVar5 + 8] == '\x01') {
            std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                      ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                       ((long)&local_410 + lVar5));
          }
          plVar4 = (long *)((long)&local_430._M_string_length + lVar5);
          plVar1 = *(long **)((long)&local_450.field_2 + lVar5 + 8);
          if (plVar4 != plVar1) {
            operator_delete(plVar1,*plVar4 + 1);
          }
          (*std::__detail::__variant::
            __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
            ::_S_vtable._M_arr[(byte)local_450.field_2._M_local_buf[lVar5]]._M_data)
                    ((anon_class_1_0_00000001 *)&local_408,
                     (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                      *)(local_470 + lVar5 + 0x10));
          local_450.field_2._M_local_buf[lVar5] = -1;
          if ((long *)(local_470 + lVar5) != *(long **)(local_470 + lVar5 + -0x10)) {
            operator_delete(*(long **)(local_470 + lVar5 + -0x10),*(long *)(local_470 + lVar5) + 1);
          }
          lVar5 = lVar5 + -0xb8;
        } while (lVar5 != 0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != &local_430.field_2) {
          operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_490._M_dataplus._M_p != &local_490.field_2) {
          operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
        }
        value_00 = value_00 + 1;
      } while (value_00 != local_410);
    }
  }
  return;
}

Assistant:

void ImportWriter::PrintRuntimeImports(io::Printer* p,
                                       bool default_cpp_symbol) const {
  // Given an override, use that.
  if (!runtime_import_prefix_.empty()) {
    for (const auto& header : protobuf_imports_) {
      p->Emit({{"import_prefix", runtime_import_prefix_}, {"header", header}},
              R"objc(
                #import "$import_prefix$/$header$"
              )objc");
    }
    return;
  }

  // If bundled, no need to do the framework support below.
  if (for_bundled_proto_) {
    ABSL_DCHECK(!default_cpp_symbol);
    for (const auto& header : protobuf_imports_) {
      p->Emit({{"header", header}},
              R"objc(
                #import "$header$"
              )objc");
    }
    return;
  }

  p->Emit(
      {
          {"cpp_symbol",
           ProtobufFrameworkImportSymbol(ProtobufLibraryFrameworkName)},
          {"maybe_default_cpp_symbol",
           [&] {
             if (default_cpp_symbol) {
               p->Emit(
                   R"objc(
                     // This CPP symbol can be defined to use imports that match up to the framework
                     // imports needed when using CocoaPods.
                     #if !defined($cpp_symbol$)
                      #define $cpp_symbol$ 0
                     #endif
                   )objc");
             }
           }},
          {"framework_name", ProtobufLibraryFrameworkName},
          {"framework_imports",
           [&] {
             for (const auto& header : protobuf_imports_) {
               p->Emit({{"header", header}},
                       R"objc(
                         #import <$framework_name$/$header$>
                       )objc");
             }
           }},
          {"raw_imports",
           [&] {
             for (const auto& header : protobuf_imports_) {
               p->Emit({{"header", header}},
                       R"objc(
                         #import "$header$"
                       )objc");
             }
           }},
      },
      R"objc(
        $maybe_default_cpp_symbol$

        #if $cpp_symbol$
         $framework_imports$
        #else
         $raw_imports$
        #endif
      )objc");
}